

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSimplexAnalysis.cpp
# Opt level: O0

void __thiscall HighsSimplexAnalysis::invertReport(HighsSimplexAnalysis *this,bool header)

{
  stringstream *this_00;
  HighsLogOptions *log_options_;
  undefined8 uVar1;
  byte in_SIL;
  long in_RDI;
  undefined8 in_R8;
  undefined8 in_R9;
  bool in_stack_0000000f;
  HighsSimplexAnalysis *in_stack_00000010;
  bool in_stack_0000003f;
  HighsSimplexAnalysis *in_stack_00000040;
  bool in_stack_0000004f;
  HighsSimplexAnalysis *in_stack_00000050;
  pointer in_stack_ffffffffffffff98;
  undefined1 header_00;
  string *psVar2;
  HighsSimplexAnalysis *in_stack_ffffffffffffffa0;
  string local_48 [39];
  undefined1 in_stack_ffffffffffffffdf;
  HighsSimplexAnalysis *in_stack_ffffffffffffffe0;
  
  this_00 = (stringstream *)operator_new(0x188);
  std::__cxx11::stringstream::stringstream(this_00);
  std::unique_ptr<std::__cxx11::stringstream,std::default_delete<std::__cxx11::stringstream>>::
  unique_ptr<std::default_delete<std::__cxx11::stringstream>,void>
            ((unique_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  std::
  unique_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=((unique_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)in_stack_ffffffffffffffa0,
              (unique_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)in_stack_ffffffffffffff98);
  header_00 = (undefined1)((ulong)in_stack_ffffffffffffff98 >> 0x38);
  std::
  unique_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)this_00);
  reportAlgorithmPhase(in_stack_00000010,in_stack_0000000f);
  reportIterationObjective(in_stack_ffffffffffffffe0,(bool)in_stack_ffffffffffffffdf);
  if ((*(byte *)(in_RDI + 0xf2) & 1) != 0) {
    if (*(int *)(in_RDI + 0xf8) == 3) {
      reportThreads(in_stack_00000040,in_stack_0000003f);
      reportMulti(in_stack_00000040,in_stack_0000003f);
    }
    reportDensity(in_stack_00000050,in_stack_0000004f);
  }
  reportInfeasibility(in_stack_00000040,in_stack_0000003f);
  reportInvert(in_stack_ffffffffffffffa0,(bool)header_00);
  log_options_ = (HighsLogOptions *)(in_RDI + 0x90);
  std::
  unique_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator->((unique_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)0x7b3444);
  psVar2 = local_48;
  std::__cxx11::stringstream::str();
  uVar1 = std::__cxx11::string::c_str();
  highsLogDev(log_options_,kInfo,"%s\n",uVar1,in_R8,in_R9,psVar2);
  std::__cxx11::string::~string(local_48);
  if ((in_SIL & 1) == 0) {
    *(int *)(in_RDI + 0x9a8) = *(int *)(in_RDI + 0x9a8) + 1;
  }
  return;
}

Assistant:

void HighsSimplexAnalysis::invertReport(const bool header) {
  analysis_log = std::unique_ptr<std::stringstream>(new std::stringstream());
  reportAlgorithmPhase(header);
  reportIterationObjective(header);
  if (analyse_simplex_runtime_data) {
    if (simplex_strategy == kSimplexStrategyDualMulti) {
      // Report on threads and PAMI
      reportThreads(header);
      reportMulti(header);
    }
    reportDensity(header);
    //  reportCondition(header);
  }
  reportInfeasibility(header);
  //  if (analyse_simplex_runtime_data)
  reportInvert(header);
  highsLogDev(log_options, HighsLogType::kInfo, "%s\n",
              analysis_log->str().c_str());
  if (!header) num_invert_report_since_last_header++;
}